

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall S2Loop::DecodeInternal(S2Loop *this,Decoder *decoder,bool within_scope)

{
  undefined1 auVar1 [16];
  uchar uVar2;
  bool bVar3;
  uint32 uVar4;
  size_t sVar5;
  S2Point *pSVar6;
  ulong uVar7;
  ulong uVar8;
  Vector3<double> *local_90;
  S2LatLngRect local_68;
  undefined1 local_29;
  uint local_28;
  bool is_misaligned;
  uint32 num_vertices;
  bool within_scope_local;
  Decoder *decoder_local;
  S2Loop *this_local;
  
  is_misaligned = within_scope;
  _num_vertices = decoder;
  decoder_local = (Decoder *)this;
  sVar5 = Decoder::avail(decoder);
  if (sVar5 < 4) {
    this_local._7_1_ = false;
  }
  else {
    local_28 = Decoder::get32(_num_vertices);
    if ((uint)FLAGS_s2polygon_decode_max_num_vertices < local_28) {
      this_local._7_1_ = false;
    }
    else {
      sVar5 = Decoder::avail(_num_vertices);
      if (sVar5 < (ulong)local_28 * 0x18 + 5) {
        this_local._7_1_ = false;
      }
      else {
        ClearIndex(this);
        if (((this->owns_vertices_ & 1U) != 0) && (this->vertices_ != (S2Point *)0x0)) {
          operator_delete__(this->vertices_);
        }
        this->num_vertices_ = local_28;
        local_29 = 0;
        if ((is_misaligned & 1U) == 0) {
          uVar7 = (ulong)this->num_vertices_;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar7;
          uVar8 = SUB168(auVar1 * ZEXT816(0x18),0);
          if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
            uVar8 = 0xffffffffffffffff;
          }
          pSVar6 = (S2Point *)operator_new__(uVar8);
          if (uVar7 != 0) {
            local_90 = pSVar6;
            do {
              Vector3<double>::Vector3(local_90);
              local_90 = local_90 + 1;
            } while (local_90 != pSVar6 + uVar7);
          }
          this->vertices_ = pSVar6;
          Decoder::getn(_num_vertices,this->vertices_,(long)this->num_vertices_ * 0x18);
          this->owns_vertices_ = true;
        }
        else {
          pSVar6 = (S2Point *)Decoder::ptr(_num_vertices);
          this->vertices_ = pSVar6;
          Decoder::skip(_num_vertices,(long)this->num_vertices_ * 0x18);
          this->owns_vertices_ = false;
        }
        uVar2 = Decoder::get8(_num_vertices);
        this->origin_inside_ = uVar2 != '\0';
        uVar4 = Decoder::get32(_num_vertices);
        this->depth_ = uVar4;
        bVar3 = S2LatLngRect::Decode(&this->bound_,_num_vertices);
        if (bVar3) {
          S2LatLngRectBounder::ExpandForSubregions(&local_68,&this->bound_);
          S2LatLngRect::operator=(&this->subregion_bound_,&local_68);
          S2LatLngRect::~S2LatLngRect(&local_68);
          if (local_28 != 0) {
            InitIndex(this);
          }
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool S2Loop::DecodeInternal(Decoder* const decoder,
                            bool within_scope) {
  // Perform all checks before modifying vertex state. Empty loops are
  // explicitly allowed here: a newly created loop has zero vertices
  // and such loops encode and decode properly.
  if (decoder->avail() < sizeof(uint32)) return false;
  const uint32 num_vertices = decoder->get32();
  if (num_vertices > FLAGS_s2polygon_decode_max_num_vertices) {
    return false;
  }
  if (decoder->avail() < (num_vertices * sizeof(*vertices_) +
                          sizeof(uint8) + sizeof(uint32))) {
    return false;
  }
  ClearIndex();
  if (owns_vertices_) delete[] vertices_;
  num_vertices_ = num_vertices;

  // x86 can do unaligned floating-point reads; however, many other
  // platforms cannot. Do not use the zero-copy version if we are on
  // an architecture that does not support unaligned reads, and the
  // pointer is not correctly aligned.
#if defined(__x86_64__) || defined(_M_X64) || defined(__i386) || \
    defined(_M_IX86)
  bool is_misaligned = false;
#else
  bool is_misaligned =
      reinterpret_cast<intptr_t>(decoder->ptr()) % sizeof(double) != 0;
#endif
  if (within_scope && !is_misaligned) {
    vertices_ = const_cast<S2Point *>(reinterpret_cast<const S2Point*>(
                    decoder->ptr()));
    decoder->skip(num_vertices_ * sizeof(*vertices_));
    owns_vertices_ = false;
  } else {
    vertices_ = new S2Point[num_vertices_];
    decoder->getn(vertices_, num_vertices_ * sizeof(*vertices_));
    owns_vertices_ = true;
  }
  origin_inside_ = decoder->get8();
  depth_ = decoder->get32();
  if (!bound_.Decode(decoder)) return false;
  subregion_bound_ = S2LatLngRectBounder::ExpandForSubregions(bound_);

  // An initialized loop will have some non-zero count of vertices. A default
  // (uninitialized) has zero vertices. This code supports encoding and
  // decoding of uninitialized loops, but we only want to call InitIndex for
  // initialized loops. Otherwise we defer InitIndex until the call to Init().
  if (num_vertices > 0) {
    InitIndex();
  }

  return true;
}